

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gogoing_util.cpp
# Opt level: O1

int going_parse_config(char *path)

{
  char cVar1;
  istream *piVar2;
  iterator iVar3;
  int iVar4;
  string *psVar5;
  string word;
  string line;
  stringstream stream;
  fstream infile;
  key_type local_408;
  undefined1 *local_3e8;
  undefined8 local_3e0;
  undefined1 local_3d8;
  undefined7 uStack_3d7;
  stringstream local_3c8 [128];
  ios_base local_348 [264];
  long local_240 [4];
  byte abStack_220 [496];
  
  going_init_config_keyword_map();
  std::fstream::fstream((istream *)local_240,path,_S_in);
  local_3e8 = &local_3d8;
  local_3e0 = 0;
  local_3d8 = 0;
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  local_408._M_string_length = 0;
  local_408.field_2._M_local_buf[0] = '\0';
  if ((abStack_220[*(long *)(local_240[0] + -0x18)] & 5) == 0) {
    while( true ) {
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_240[0] + -0x18) +
                              (char)(istream *)local_240);
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_240,(string *)&local_3e8,cVar1);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::stringstream::stringstream(local_3c8,(string *)&local_3e8,_S_out|_S_in);
      std::operator>>((istream *)local_3c8,(string *)&local_408);
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&going_config_keyword_map_abi_cxx11_._M_t,&local_408);
      if ((_Rb_tree_header *)iVar3._M_node ==
          &going_config_keyword_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        puts("can\'t find keyword.");
LAB_001066b6:
        std::fstream::close();
        std::__cxx11::stringstream::~stringstream(local_3c8);
        std::ios_base::~ios_base(local_348);
        iVar4 = -1;
        goto LAB_001066e6;
      }
      if (iVar3._M_node[2]._M_color == 2) {
        psVar5 = &going_domain_abi_cxx11_;
      }
      else {
        psVar5 = &going_docroot_abi_cxx11_;
        if (iVar3._M_node[2]._M_color != _S_black) goto LAB_001066b6;
      }
      std::operator>>((istream *)local_3c8,(string *)psVar5);
      std::__cxx11::stringstream::~stringstream(local_3c8);
      std::ios_base::~ios_base(local_348);
    }
    iVar4 = 0;
    std::fstream::close();
  }
  else {
    printf("%s can\'t open\n",path);
    iVar4 = -1;
    std::fstream::close();
  }
LAB_001066e6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,
                    CONCAT71(local_408.field_2._M_allocated_capacity._1_7_,
                             local_408.field_2._M_local_buf[0]) + 1);
  }
  if (local_3e8 != &local_3d8) {
    operator_delete(local_3e8,CONCAT71(uStack_3d7,local_3d8) + 1);
  }
  std::fstream::~fstream(local_240);
  return iVar4;
}

Assistant:

int going_parse_config(const char *path)
{
	going_init_config_keyword_map();
	fstream infile(path, fstream::in);
	string line, word;
	if(!infile){
		printf("%s can't open\n", path);
		infile.close();
		return -1;
	}
	while(getline(infile, line))
	{
		stringstream stream(line);
		stream >> word;//keyword
		map<string, int>::const_iterator cit = going_config_keyword_map.find(word);
		if(cit == going_config_keyword_map.end()){
			printf("can't find keyword.\n");
			infile.close();
			return -1;
		}
		switch(cit -> second){
			case GOING_DOCROOT:
				stream >> going_docroot;
				break;
			case GOING_DOMAIN:
				stream >> going_domain;
				break;
			default:
				infile.close();
				return -1;
		}
	}
	infile.close();
	return 0;
}